

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O1

void __thiscall cmInstallTargetGenerator::GenerateScript(cmInstallTargetGenerator *this,ostream *os)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  string *psVar2;
  ostream *poVar3;
  ostringstream msg;
  long *local_1c0;
  long local_1b0 [2];
  undefined1 local_1a0 [112];
  ios_base local_130 [264];
  
  this_00 = this->Target;
  local_1a0._0_8_ = local_1a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"EXCLUDE_FROM_ALL","");
  bVar1 = cmGeneratorTarget::GetPropertyAsBool(this_00,(string *)local_1a0);
  if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"WARNING: Target \"",0x11);
    psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,(psVar2->_M_dataplus)._M_p,psVar2->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"\" has EXCLUDE_FROM_ALL set and will not be built by default ",0x3c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"but an install rule has been provided for it.  CMake does ",0x3a);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"not define behavior for this case.",0x22);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Message((char *)local_1c0,"Warning");
    if (local_1c0 != local_1b0) {
      operator_delete(local_1c0,local_1b0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base(local_130);
  }
  cmInstallGenerator::GenerateScript(&this->super_cmInstallGenerator,os);
  return;
}

Assistant:

void cmInstallTargetGenerator::GenerateScript(std::ostream& os)
{
  // Warn if installing an exclude-from-all target.
  if(this->Target->GetPropertyAsBool("EXCLUDE_FROM_ALL"))
    {
    std::ostringstream msg;
    msg << "WARNING: Target \"" << this->Target->GetName()
        << "\" has EXCLUDE_FROM_ALL set and will not be built by default "
        << "but an install rule has been provided for it.  CMake does "
        << "not define behavior for this case.";
    cmSystemTools::Message(msg.str().c_str(), "Warning");
    }

  // Perform the main install script generation.
  this->cmInstallGenerator::GenerateScript(os);
}